

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom64.cc
# Opt level: O1

int test_atom64(hwtest_ctx *ctx)

{
  unsigned_short *__xsubi;
  undefined8 uVar1;
  void *pvVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  nva_card **ppnVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint64_t uVar16;
  uint uVar17;
  uint64_t uVar18;
  uint64_t uVar19;
  bool bVar20;
  uint uVar21;
  char local_3058;
  char local_3050;
  char local_3040;
  uint64_t src1 [512];
  uint64_t src3 [512];
  uint64_t src2 [512];
  uint64_t uStack_38;
  
  __xsubi = ctx->rand48;
  iVar14 = 0;
  do {
    lVar8 = jrand48(__xsubi);
    uVar17 = (uint)lVar8 & 0xfff0000 | 0xd0000011;
    uVar9 = jrand48(__xsubi);
    uVar21 = (uint)uVar9;
    uVar15 = uVar21 & 0x3f1ff03c | 0xc08007c0;
    lVar8 = jrand48(__xsubi);
    uVar6 = (uint)(uVar9 >> 2) & 0xf;
    if ((uVar21 >> 0x1d & 1) == 0) {
      bVar20 = false;
      if (uVar6 != 2) goto LAB_002c642b;
    }
    else {
      uVar17 = uVar17 & 0xdf800001 | 0x40020;
      if (uVar6 == 2) {
        uVar15 = uVar21 & 0x3f00303c | 0xc08187c0;
      }
LAB_002c642b:
      bVar20 = false;
      if (uVar6 != 3) {
        iVar7 = g80_gr_mthd(ctx,3,0x3a8,0x40);
        bVar20 = true;
        if ((iVar7 == 0) && (iVar7 = g80_gr_mthd(ctx,3,0x3ac,0x10200), iVar7 == 0)) {
          bVar20 = true;
          iVar7 = g80_gr_mthd(ctx,3,0x3b0,1);
          if ((iVar7 == 0) &&
             ((iVar7 = g80_gr_mthd(ctx,3,0x2c0,10), iVar7 == 0 &&
              (iVar7 = g80_gr_mthd(ctx,3,0x2b4,0x10200), iVar7 == 0)))) {
            bVar20 = true;
            iVar7 = g80_gr_mthd(ctx,3,0x2b8,1);
            if ((iVar7 == 0) && (iVar7 = g80_gr_mthd(ctx,3,0x3b8,2), iVar7 == 0)) {
              bVar20 = true;
              iVar7 = g80_gr_mthd(ctx,3,0x2f8,1);
              if (((((iVar7 == 0) && (iVar7 = g80_gr_mthd(ctx,3,0x388,0), iVar7 == 0)) &&
                   (iVar7 = g80_gr_mthd(ctx,3,0x3a4,0x10001), iVar7 == 0)) &&
                  ((iVar7 = g80_gr_mthd(ctx,3,0x374,0), iVar7 == 0 &&
                   (iVar7 = g80_gr_mthd(ctx,3,900,0x100), iVar7 == 0)))) &&
                 (iVar7 = g80_gr_mthd(ctx,3,0x37c,((uint)lVar8 & 2) << 0xf | (uint)lVar8 & 1),
                 ppnVar5 = nva_cards, iVar7 == 0)) {
                src1[0] = 0xc410078030030001;
                src1[1] = 0x10320008005;
                src1[2] = 0x20320008009;
                src1[3] = 0x3032000800d;
                src1[4] = 0x3100f8011;
                src1[5] = 0xa000078000000801;
                src1[6] = 0x80800780d0000211;
                src1[7] = 0x80800780d0000419;
                src1[8]._0_4_ = uVar17;
                src1[8]._4_4_ = uVar15;
                src1[9] = 0xa0800780d0000421;
                src1[10] = 0x200007800000001d;
                src1[0xb] = 0xa0c00780d000021d;
                src1[0xc] = 0xe0000781f0000001;
                *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x100;
                lVar8 = 0;
                do {
                  *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 * 4 + 0x730000) =
                       *(undefined4 *)((long)src1 + lVar8 * 4);
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x1a);
                *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
                do {
                } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
                iVar7 = g80_gr_mthd(ctx,3,0x380,0);
                if (iVar7 == 0) {
                  uVar9 = jrand48(__xsubi);
                  lVar8 = 0;
                  do {
                    uVar10 = jrand48(__xsubi);
                    lVar11 = jrand48(__xsubi);
                    src1[lVar8] = lVar11 << 0x20 | uVar10 & 0xffffffff;
                    uVar12 = jrand48(__xsubi);
                    lVar11 = jrand48(__xsubi);
                    src2[lVar8] = lVar11 << 0x20 | uVar12 & 0xffffffff;
                    uVar13 = jrand48(__xsubi);
                    lVar11 = jrand48(__xsubi);
                    ppnVar5 = nva_cards;
                    src3[lVar8] = lVar11 << 0x20 | uVar13 & 0xffffffff;
                    if ((uVar9 & 1) != 0) {
                      local_3050 = (char)uVar10;
                      src1[lVar8] = (long)local_3050;
                    }
                    if ((uVar9 & 2) != 0) {
                      local_3058 = (char)uVar12;
                      src2[lVar8] = (long)local_3058;
                    }
                    if ((uVar9 & 4) != 0) {
                      local_3040 = (char)uVar13;
                      src3[lVar8] = (long)local_3040;
                    }
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 0x200);
                  *(undefined4 *)((long)nva_cards[ctx->cnum]->bar0 + 0x1700) = 0x200;
                  lVar8 = 0;
                  do {
                    uVar1 = *(undefined8 *)((long)src1 + lVar8);
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x700000) = (int)uVar1;
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x700004) =
                         (int)((ulong)uVar1 >> 0x20);
                    uVar1 = *(undefined8 *)((long)src2 + lVar8);
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x701000) = (int)uVar1;
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x701004) =
                         (int)((ulong)uVar1 >> 0x20);
                    uVar1 = *(undefined8 *)((long)src3 + lVar8);
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x702000) = (int)uVar1;
                    *(int *)((long)ppnVar5[ctx->cnum]->bar0 + lVar8 + 0x702004) =
                         (int)((ulong)uVar1 >> 0x20);
                    lVar8 = lVar8 + 8;
                  } while (lVar8 != 0x1000);
                  *(undefined4 *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) = 1;
                  do {
                  } while (*(int *)((long)ppnVar5[ctx->cnum]->bar0 + 0x70000) != 0);
                  iVar7 = g80_gr_mthd(ctx,3,0x368,0);
                  bVar20 = true;
                  if ((iVar7 == 0) && (iVar7 = g80_gr_idle(ctx), iVar7 == 0)) {
                    pvVar2 = nva_cards[ctx->cnum]->bar0;
                    lVar8 = -0x200;
                    do {
                      uVar6 = *(uint *)((long)pvVar2 + lVar8 * 8 + 0x702000);
                      uVar3 = src3[lVar8];
                      uVar4 = (&uStack_38)[lVar8];
                      uVar19 = uVar4;
                      switch(uVar15 >> 2 & 0xf) {
                      case 0:
                        uVar19 = uVar4 + uVar3;
                        break;
                      case 2:
                        uVar19 = uVar3;
                        if (uVar3 == uVar4) {
                          uVar19 = src2[lVar8];
                        }
                        break;
                      case 3:
                        abort();
                      }
                      uVar16 = CONCAT44(*(undefined4 *)((long)pvVar2 + lVar8 * 8 + 0x701004),
                                        *(undefined4 *)((long)pvVar2 + lVar8 * 8 + 0x701000));
                      uVar18 = CONCAT44(*(undefined4 *)((long)pvVar2 + lVar8 * 8 + 0x703004),
                                        *(undefined4 *)((long)pvVar2 + lVar8 * 8 + 0x703000));
                      bVar20 = uVar18 != uVar3 && 0xdfffffff < uVar15 ||
                               (uVar6 != 0xf || uVar16 != uVar19);
                      if (bVar20) {
                        printf("atom64 %08x %08x (%016lx %016lx %016lx %016lx)[%d]: got %016lx.%x %016lx expected %016lx.%x %016lx\n"
                               ,(ulong)uVar17,(ulong)uVar15,uVar3,uVar4,src2[lVar8],uVar3,
                               (ulong)((int)lVar8 + 0x200U & 3),uVar16,(ulong)uVar6,uVar18,uVar19,
                               0xf,uVar3);
                        break;
                      }
                      lVar8 = lVar8 + 1;
                    } while (lVar8 != 0);
                  }
                }
              }
            }
          }
        }
      }
    }
    if (bVar20) {
      return 3;
    }
    iVar14 = iVar14 + 1;
    if (iVar14 == 100000) {
      return 1;
    }
  } while( true );
}

Assistant:

static int test_atom64(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000011 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc08007c0 | (jrand48(ctx->rand48) & 0x3f1ff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x040020;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom64_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom64_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint64_t src1[0x200], src2[0x200], src3[0x200];
		atom64_gen(ctx, src1, src2, src3);
		if (atom64_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}